

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<double>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Vec3<double>_> *this,OStream *os,int version)

{
  double local_20;
  
  local_20 = (this->_value).x;
  (*os->_vptr_OStream[2])(os,&local_20,8);
  local_20 = (this->_value).y;
  (*os->_vptr_OStream[2])(os,&local_20,8);
  local_20 = (this->_value).z;
  (*os->_vptr_OStream[2])(os,&local_20,8);
  return;
}

Assistant:

void
V3dAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.x);
    Xdr::write <StreamIO> (os, _value.y);
    Xdr::write <StreamIO> (os, _value.z);
}